

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_otherTypeMoveAssignmentEmptyForNotEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
::TestBody(optTyped_otherTypeMoveAssignmentEmptyForNotEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
           *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  opt_type o2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  storage_type local_51;
  AssertHelper local_50;
  storage_type local_48;
  undefined7 uStack_47;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  string local_30;
  
  local_51 = (storage_type)
             (this->
             super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
             ).value_1.value_;
  if (local_51.null_value != '\a') {
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::operator=<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>,_true>
              ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
                *)&local_51.value,
               (opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_> *)
               0xff);
    local_48 = (storage_type)(local_51.null_value == '\a');
    local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_48.null_value) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,(internal *)&local_48.value,(AssertionResult *)0x1b9f12,"true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x2f0,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                         (char)local_30._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
          &local_30.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p),
                        local_30.field_2._M_allocated_capacity + 1);
      }
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_48 = (storage_type)(local_51.null_value == '\a');
    local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_48.null_value) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,(internal *)&local_48.value,(AssertionResult *)"o2.has_value()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x2f1,(char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                         (char)local_30._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
          &local_30.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p),
                        local_30.field_2._M_allocated_capacity + 1);
      }
      if (local_50.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::
      opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
      value((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
             *)&local_51.value);
    }
    testing::Message::Message((Message *)&local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48.value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x2f2,
               "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48.value,(Message *)&local_30)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48.value);
    if (CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_30._M_dataplus._M_p._1_7_,(char)local_30._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_30._M_dataplus._M_p._1_7_,
                                       (char)local_30._M_dataplus._M_p) + 8))();
      }
    }
    local_48.null_value =
         (this->
         super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
         ).value_2.value_;
    if (local_51.null_value != '\a') {
      local_48 = local_51;
    }
    testing::internal::EqHelper<false>::
    Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
              ((EqHelper<false> *)&local_30,"this->value_2","o2.value_or(this->value_2)",
               &(this->
                super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
                ).value_2,&local_48.value);
    if ((char)local_30._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_48.value);
      if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)local_30._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x2f3,message);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48.value);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (CONCAT71(uStack_47,local_48.null_value) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT71(uStack_47,local_48.null_value) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(uStack_47,local_48.null_value) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_30._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/include/opt.h",
                0x7e,
                "mp::opt<(anonymous namespace)::weekday>::opt(U &&) [T = (anonymous namespace)::weekday, Policy = mp::opt_default_policy<weekday>, U = const (anonymous namespace)::weekday &]"
               );
}

Assistant:

TYPED_TEST(optTyped, otherTypeMoveAssignmentEmptyForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2{this->value_1};
  o2 = std::move(o1);
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}